

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall OpenMD::Electrostatic::ReciprocalSpaceSum(Electrostatic *this,RealType *pot)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  pointer ppAVar12;
  double dVar13;
  int iVar14;
  int iVar15;
  size_type __n;
  Molecule *pMVar16;
  pointer pdVar17;
  int iVar18;
  uint uVar19;
  pointer ppAVar20;
  int iVar21;
  Vector<double,_3U> *v1;
  long lVar22;
  long lVar23;
  Atom *pAVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  pointer local_5d0;
  double local_5c8;
  MoleculeIterator mi;
  double local_590;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ems;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  els;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  enc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  emc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ens;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elc;
  Vector3d kVec;
  vector<double,_std::allocator<double>_> skr;
  vector<double,_std::allocator<double>_> ckr;
  Vector3d tt;
  vector<double,_std::allocator<double>_> qks;
  vector<double,_std::allocator<double>_> qkc;
  vector<double,_std::allocator<double>_> dks;
  vector<double,_std::allocator<double>_> dkc;
  vector<double,_std::allocator<double>_> cks;
  vector<double,_std::allocator<double>_> ckc;
  vector<double,_std::allocator<double>_> AK;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> qxk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> dxk;
  vector<double,_std::allocator<double>_> slm;
  vector<double,_std::allocator<double>_> clm;
  Vector3d box;
  ElectrostaticAtomData data;
  Mat3x3d Kmat;
  Vector3d Qk;
  RectMatrix<double,_3U,_3U> local_1e0;
  Vector3d D;
  Vector3d r;
  Vector3d t;
  RectMatrix<double,_3U,_3U> local_150;
  RectMatrix<double,_3U,_3U> local_108;
  Mat3x3d Q;
  Mat3x3d hmat;
  
  Snapshot::getHmat((Mat3x3d *)&hmat.super_SquareMatrix<double,_3>,
                    this->info_->sman_->currentSnapshot_);
  SquareMatrix<double,_3>::diagonals
            ((Vector<double,_3U> *)&data,&hmat.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&box.super_Vector<double,_3U>,(Vector<double,_3U> *)&data);
  dVar30 = Vector<double,_3U>::max(&box.super_Vector<double,_3U>);
  data.is_Charge = false;
  data.is_Dipole = false;
  data.is_Quadrupole = false;
  data.is_Fluctuating = false;
  data.uses_SlaterIntramolecular = false;
  data._5_3_ = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&AK,0x34,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
  dVar31 = this->dampingAlpha_;
  if (1e-12 <= dVar31) {
    elc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    emc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    elc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    enc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    emc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    emc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    els.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    enc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    enc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ems.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    els.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    els.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ens.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ems.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ems.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ens.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ens.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = (size_type)this->info_->nAtoms_;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&elc,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&emc,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&enc,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&els,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&ems,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&ens,9);
    dVar30 = 6.283185307179586 / dVar30;
    dVar13 = 6.283185307179586 /
             (box.super_Vector<double,_3U>.data_[0] * box.super_Vector<double,_3U>.data_[1] *
             box.super_Vector<double,_3U>.data_[2]);
    dVar31 = -0.25 / (dVar31 * dVar31);
    for (lVar23 = 0; lVar23 != 0xd8; lVar23 = lVar23 + 0x18) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((elc.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((emc.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((enc.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((els.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((ems.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((ens.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar23),__n);
    }
    Kmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         6.283185307179586;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&data,(double *)&Kmat);
    Vector<double,_3U>::Vector(&t.super_Vector<double,_3U>,(Vector<double,_3U> *)&data);
    Vector<double,_3U>::Vdiv
              (&t.super_Vector<double,_3U>,&t.super_Vector<double,_3U>,&box.super_Vector<double,_3U>
              );
    mi._M_node = (_Base_ptr)0x0;
    Vector<double,_3U>::Vector(&r.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&tt.super_Vector<double,_3U>);
    pMVar16 = SimInfo::beginMolecule(this->info_,&mi);
    while (pMVar16 != (Molecule *)0x0) {
      ppAVar20 = (pMVar16->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar20 !=
          (pMVar16->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_002033ee;
      pAVar24 = (Atom *)0x0;
      while( true ) {
        if (pAVar24 == (Atom *)0x0) break;
        lVar27 = (long)(pAVar24->super_StuntDouble).localIndex_;
        StuntDouble::getPos((Vector3d *)&data,&pAVar24->super_StuntDouble);
        Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,(Vector<double,_3U> *)&data);
        Snapshot::wrapVector
                  (this->info_->sman_->currentSnapshot_,(Vector3d *)&r.super_Vector<double,_3U>);
        Vector<double,_3U>::Vmul
                  (&tt.super_Vector<double,_3U>,&t.super_Vector<double,_3U>,
                   &r.super_Vector<double,_3U>);
        elc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 1.0;
        emc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 1.0;
        enc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 1.0;
        els.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 0.0;
        ems.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 0.0;
        ens.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = 0.0;
        dVar32 = cos(tt.super_Vector<double,_3U>.data_[0]);
        elc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = dVar32;
        dVar32 = cos(tt.super_Vector<double,_3U>.data_[1]);
        emc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = dVar32;
        dVar32 = cos(tt.super_Vector<double,_3U>.data_[2]);
        enc.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = dVar32;
        dVar32 = sin(tt.super_Vector<double,_3U>.data_[0]);
        els.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = dVar32;
        dVar32 = sin(tt.super_Vector<double,_3U>.data_[1]);
        ems.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar27] = dVar32;
        dVar32 = sin(tt.super_Vector<double,_3U>.data_[2]);
        pdVar17 = ens.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar17[lVar27] = dVar32;
        pdVar2 = elc.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3 = els.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4 = emc.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar5 = ems.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6 = enc.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        for (lVar23 = 0x48; lVar23 != 0xd8; lVar23 = lVar23 + 0x18) {
          lVar22 = *(long *)((long)&elc.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar23);
          lVar7 = *(long *)((long)&els.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar23);
          *(double *)
           (*(long *)((long)&((elc.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar22 + lVar27 * 8) * pdVar2[lVar27] -
               pdVar3[lVar27] * *(double *)(lVar7 + lVar27 * 8);
          lVar8 = *(long *)((long)&emc.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar23);
          lVar9 = *(long *)((long)&ems.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar23);
          *(double *)
           (*(long *)((long)&((emc.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar8 + lVar27 * 8) * pdVar4[lVar27] -
               pdVar5[lVar27] * *(double *)(lVar9 + lVar27 * 8);
          lVar10 = *(long *)((long)&enc.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar23);
          lVar11 = *(long *)((long)&ens.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar23);
          *(double *)
           (*(long *)((long)&((enc.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar10 + lVar27 * 8) * pdVar6[lVar27] -
               pdVar17[lVar27] * *(double *)(lVar11 + lVar27 * 8);
          *(double *)
           (*(long *)((long)&((els.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar7 + lVar27 * 8) * pdVar2[lVar27] +
               *(double *)(lVar22 + lVar27 * 8) * pdVar3[lVar27];
          *(double *)
           (*(long *)((long)&((ems.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar9 + lVar27 * 8) * pdVar4[lVar27] +
               *(double *)(lVar8 + lVar27 * 8) * pdVar5[lVar27];
          *(double *)
           (*(long *)((long)&((ens.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar23) + lVar27 * 8) =
               *(double *)(lVar11 + lVar27 * 8) * pdVar6[lVar27] +
               *(double *)(lVar10 + lVar27 * 8) * pdVar17[lVar27];
        }
        ppAVar20 = ppAVar20 + 1;
        pAVar24 = (Atom *)0x0;
        if (ppAVar20 !=
            (pMVar16->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_002033ee:
          pAVar24 = *ppAVar20;
        }
      }
      pMVar16 = SimInfo::nextMolecule(this->info_,&mi);
    }
    uVar28 = 0;
    uVar29 = 0;
    if (dVar31 < 0.0) {
      dVar31 = exp(dVar31 * dVar30 * dVar30);
      uVar28 = SUB84(dVar31,0);
      uVar29 = (undefined4)((ulong)dVar31 >> 0x20);
    }
    dVar31 = 1.0;
    for (lVar23 = 1; lVar23 != 0x34; lVar23 = lVar23 + 1) {
      dVar31 = dVar31 * (double)CONCAT44(uVar29,uVar28);
      AK.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar23] = (dVar31 * 332.0637778) / ((double)(int)lVar23 * dVar30 * dVar30);
    }
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&clm,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&slm,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&ckr,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&skr,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&ckc,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&cks,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&dkc,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&dks,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&qkc,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    data.is_Charge = false;
    data.is_Dipole = false;
    data.is_Quadrupole = false;
    data.is_Fluctuating = false;
    data.uses_SlaterIntramolecular = false;
    data._5_3_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&qks,__n,(value_type_conflict2 *)&data,(allocator_type *)&Kmat);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&dxk,__n,(value_type *)OpenMD::V3Zero,(allocator_type *)&data);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&qxk,__n,(value_type *)OpenMD::V3Zero,(allocator_type *)&data);
    Vector<double,_3U>::Vector(&kVec.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&Qk.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix(&Kmat.super_SquareMatrix<double,_3>);
    ElectrostaticAtomData::ElectrostaticAtomData(&data);
    Vector<double,_3U>::Vector(&D.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix(&Q.super_SquareMatrix<double,_3>);
    dVar31 = dVar13 * 4.0;
    local_590 = 0.0;
    uVar26 = 8;
    iVar25 = 9;
    for (lVar23 = 1; lVar23 != 9; lVar23 = lVar23 + 1) {
      iVar14 = (int)lVar23 + -1;
      for (; uVar26 != 0x10; uVar26 = uVar26 + 1) {
        pMVar16 = SimInfo::beginMolecule(this->info_,&mi);
        iVar21 = uVar26 - 8;
        iVar18 = -iVar21;
        if (0 < iVar21) {
          iVar18 = iVar21;
        }
        while (pMVar16 != (Molecule *)0x0) {
          ppAVar20 = (pMVar16->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar12 = (pMVar16->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if (ppAVar20 == ppAVar12) {
            pAVar24 = (Atom *)0x0;
          }
          else {
            pAVar24 = *ppAVar20;
          }
          while (ppAVar20 = ppAVar20 + 1, pAVar24 != (Atom *)0x0) {
            iVar15 = (pAVar24->super_StuntDouble).localIndex_;
            pdVar17 = elc.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar23].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar2 = emc.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar18 + 1U].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = els.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar23].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = ems.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar18 + 1U].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar26 < 8) {
              clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar15] =
                   pdVar2[iVar15] * pdVar17[iVar15] + pdVar3[iVar15] * pdVar4[iVar15];
              dVar30 = pdVar3[iVar15] * pdVar2[iVar15] - pdVar17[iVar15] * pdVar4[iVar15];
            }
            else {
              clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar15] =
                   pdVar2[iVar15] * pdVar17[iVar15] - pdVar4[iVar15] * pdVar3[iVar15];
              dVar30 = pdVar3[iVar15] * pdVar2[iVar15] + pdVar4[iVar15] * pdVar17[iVar15];
            }
            slm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar15] = dVar30;
            if (ppAVar20 == ppAVar12) {
              pAVar24 = (Atom *)0x0;
            }
            else {
              pAVar24 = *ppAVar20;
            }
          }
          pMVar16 = SimInfo::nextMolecule(this->info_,&mi);
        }
        for (; iVar25 < 0x10; iVar25 = iVar25 + 1) {
          iVar15 = iVar25 + -8;
          iVar18 = -iVar15;
          if (0 < iVar15) {
            iVar18 = iVar15;
          }
          uVar19 = iVar15 * iVar15 + iVar21 * iVar21 + iVar14 * iVar14;
          if (uVar19 < 0x34) {
            Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_150);
            local_150.data_[0][0] =
                 (double)iVar14 * (6.283185307179586 / box.super_Vector<double,_3U>.data_[0]);
            local_150.data_[0][1] =
                 (double)iVar21 * (6.283185307179586 / box.super_Vector<double,_3U>.data_[1]);
            local_150.data_[0][2] =
                 (double)iVar15 * (6.283185307179586 / box.super_Vector<double,_3U>.data_[2]);
            Vector<double,_3U>::operator=
                      (&kVec.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_150);
            outProduct<double>((SquareMatrix3<double> *)&local_150,
                               (Vector3<double> *)&kVec.super_Vector<double,_3U>,
                               (Vector3<double> *)&kVec.super_Vector<double,_3U>);
            RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&Kmat,&local_150);
            pMVar16 = SimInfo::beginMolecule(this->info_,&mi);
            while (pMVar16 != (Molecule *)0x0) {
              ppAVar20 = (pMVar16->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppAVar12 = (pMVar16->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
              if (ppAVar20 == ppAVar12) {
                pAVar24 = (Atom *)0x0;
              }
              else {
                pAVar24 = *ppAVar20;
              }
              while (ppAVar20 = ppAVar20 + 1, pAVar24 != (Atom *)0x0) {
                iVar15 = (pAVar24->super_StuntDouble).localIndex_;
                pdVar17 = enc.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar2 = ens.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar18 + 1U].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (iVar25 < 8) {
                  ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar15] =
                       pdVar17[iVar15] *
                       clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar15] +
                       slm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar15] * pdVar2[iVar15];
                  dVar30 = slm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar15] * pdVar17[iVar15] -
                           pdVar2[iVar15] *
                           clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar15];
                }
                else {
                  ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar15] =
                       pdVar17[iVar15] *
                       clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar15] -
                       pdVar2[iVar15] *
                       slm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar15];
                  dVar30 = slm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar15] * pdVar17[iVar15] +
                           clm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar15] * pdVar2[iVar15];
                }
                skr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15] = dVar30;
                if (ppAVar20 == ppAVar12) {
                  pAVar24 = (Atom *)0x0;
                }
                else {
                  pAVar24 = *ppAVar20;
                }
              }
              pMVar16 = SimInfo::nextMolecule(this->info_,&mi);
            }
            pMVar16 = SimInfo::beginMolecule(this->info_,&mi);
LAB_00203aa8:
            if (pMVar16 != (Molecule *)0x0) {
              local_5d0 = (pMVar16->atoms_).
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              if (local_5d0 ==
                  (pMVar16->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pAVar24 = (Atom *)0x0;
                goto LAB_00203aec;
              }
              do {
                pAVar24 = *local_5d0;
LAB_00203aec:
                do {
                  if (pAVar24 == (Atom *)0x0) {
                    pMVar16 = SimInfo::nextMolecule(this->info_,&mi);
                    goto LAB_00203aa8;
                  }
                  iVar18 = (pAVar24->super_StuntDouble).localIndex_;
                  iVar15 = AtomType::getIdent(pAVar24->atomType_);
                  ElectrostaticAtomData::operator=
                            (&data,(this->ElectrostaticMap).
                                   super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                   (this->Etids).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar15]);
                  if (data.is_Charge == true) {
                    dVar30 = data.fixedCharge;
                    if (data.is_Fluctuating == true) {
                      dVar30 = data.fixedCharge +
                               *(double *)
                                (*(long *)((long)&(((pAVar24->super_StuntDouble).snapshotMan_)->
                                                   currentSnapshot_->atomData).flucQPos.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                          (pAVar24->super_StuntDouble).storage_) +
                                (long)(pAVar24->super_StuntDouble).localIndex_ * 8);
                    }
                    ckc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar18] * dVar30;
                    cks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         dVar30 * skr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar18];
                  }
                  if (data.is_Dipole == true) {
                    StuntDouble::getDipole((Vector3d *)&local_1e0,&pAVar24->super_StuntDouble);
                    operator*((Vector<double,_3U> *)&local_150,(Vector<double,_3U> *)&local_1e0,
                              0.20819434);
                    Vector3<double>::operator=(&D,(Vector<double,_3U> *)&local_150);
                    dVar30 = dot<double,3u>(&D.super_Vector<double,_3U>,
                                            &kVec.super_Vector<double,_3U>);
                    cross<double>((Vector3<double> *)&local_150,
                                  (Vector3<double> *)&D.super_Vector<double,_3U>,
                                  (Vector3<double> *)&kVec.super_Vector<double,_3U>);
                    Vector<double,_3U>::operator=
                              (&dxk.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar18].
                                super_Vector<double,_3U>,(Vector<double,_3U> *)&local_150);
                    dkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar18] * dVar30;
                    dks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         dVar30 * skr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar18];
                  }
                  if (data.is_Quadrupole == true) {
                    StuntDouble::getQuadrupole((Mat3x3d *)&local_108,&pAVar24->super_StuntDouble);
                    operator*(&local_1e0,&local_108,0.20819434);
                    RectMatrix<double,_3U,_3U>::operator=(&local_150,&local_1e0);
                    SquareMatrix3<double>::operator=
                              ((SquareMatrix3<double> *)&Q,(SquareMatrix<double,_3> *)&local_150);
                    operator*((Vector<double,_3U> *)&local_150,(RectMatrix<double,_3U,_3U> *)&Q,
                              &kVec.super_Vector<double,_3U>);
                    Vector3<double>::operator=
                              ((Vector3<double> *)&Qk.super_Vector<double,_3U>,
                               (Vector<double,_3U> *)&local_150);
                    dVar30 = dot<double,3u>(&kVec.super_Vector<double,_3U>,
                                            &Qk.super_Vector<double,_3U>);
                    cross<double>((Vector3<double> *)&local_1e0,
                                  (Vector3<double> *)&kVec.super_Vector<double,_3U>,
                                  (Vector3<double> *)&Qk.super_Vector<double,_3U>);
                    operator-((Vector<double,_3U> *)&local_150,(OpenMD *)&local_1e0,v1);
                    Vector3<double>::operator=
                              (qxk.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar18,
                               (Vector<double,_3U> *)&local_150);
                    qkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar18] * dVar30;
                    qks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18] =
                         dVar30 * skr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar18];
                  }
                  local_5d0 = local_5d0 + 1;
                  pAVar24 = (Atom *)0x0;
                } while (local_5d0 ==
                         (pMVar16->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_finish);
              } while( true );
            }
            local_5d0 = (pointer)0x0;
            for (pdVar17 = ckc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                ckc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              local_5d0 = (pointer)((double)local_5d0 + *pdVar17);
            }
            local_5c8 = 0.0;
            for (pdVar17 = cks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                cks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              local_5c8 = local_5c8 + *pdVar17;
            }
            dVar30 = 0.0;
            for (pdVar17 = dkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                dkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              dVar30 = dVar30 + *pdVar17;
            }
            dVar32 = 0.0;
            for (pdVar17 = dks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                dks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              dVar32 = dVar32 + *pdVar17;
            }
            dVar33 = 0.0;
            for (pdVar17 = qkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                qkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              dVar33 = dVar33 + *pdVar17;
            }
            dVar34 = 0.0;
            for (pdVar17 = qks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar17 !=
                qks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
              dVar34 = dVar34 + *pdVar17;
            }
            dVar1 = AK.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar19];
            pMVar16 = SimInfo::beginMolecule(this->info_,&mi);
            dVar34 = (local_5c8 + dVar30) - dVar34;
            dVar33 = ((double)local_5d0 - dVar32) - dVar33;
            local_590 = local_590 + dVar1 * (dVar13 + dVar13) * (dVar34 * dVar34 + dVar33 * dVar33);
            while (pMVar16 != (Molecule *)0x0) {
              ppAVar20 = (pMVar16->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              if (ppAVar20 !=
                  (pMVar16->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) goto LAB_002041ca;
              pAVar24 = (Atom *)0x0;
              while (pAVar24 != (Atom *)0x0) {
                iVar18 = (pAVar24->super_StuntDouble).localIndex_;
                iVar15 = AtomType::getIdent(pAVar24->atomType_);
                ElectrostaticAtomData::operator=
                          (&data,(this->ElectrostaticMap).
                                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                 (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start[iVar15]);
                dVar30 = AK.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar19];
                dVar32 = skr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar18];
                dVar1 = ckr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar18];
                operator*((Vector<double,_3U> *)&local_1e0,
                          (((cks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar18] +
                            dkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar18]) -
                           qks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar18]) * dVar33 -
                          ((ckc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar18] -
                           dks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar18]) -
                          qkc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar18]) * dVar34) * dVar30 * dVar31,
                          &kVec.super_Vector<double,_3U>);
                Vector<double,_3U>::Vector
                          ((Vector<double,_3U> *)&local_150,(Vector<double,_3U> *)&local_1e0);
                StuntDouble::addFrc(&pAVar24->super_StuntDouble,(Vector3d *)&local_150);
                dVar35 = (dVar1 * dVar33 + dVar34 * dVar32) * (dVar30 + dVar30);
                if (data.is_Fluctuating == true) {
                  lVar22 = (long)(pAVar24->super_StuntDouble).localIndex_;
                  lVar27 = *(long *)((long)&(((pAVar24->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).flucQFrc.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                    (pAVar24->super_StuntDouble).storage_);
                  *(double *)(lVar27 + lVar22 * 8) =
                       *(double *)(lVar27 + lVar22 * 8) - (dVar13 + dVar13) * dVar35;
                }
                if (data.is_Dipole == true) {
                  operator*((Vector<double,_3U> *)&local_1e0,
                            dVar30 * (dVar32 * dVar33 - dVar1 * dVar34) * dVar31,
                            &dxk.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar18].
                             super_Vector<double,_3U>);
                  Vector<double,_3U>::Vector
                            ((Vector<double,_3U> *)&local_150,(Vector<double,_3U> *)&local_1e0);
                  StuntDouble::addTrq(&pAVar24->super_StuntDouble,(Vector3d *)&local_150);
                }
                if (data.is_Quadrupole == true) {
                  operator*((Vector<double,_3U> *)&local_1e0,dVar35 * dVar31,
                            &qxk.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar18].
                             super_Vector<double,_3U>);
                  Vector<double,_3U>::Vector
                            ((Vector<double,_3U> *)&local_150,(Vector<double,_3U> *)&local_1e0);
                  StuntDouble::addTrq(&pAVar24->super_StuntDouble,(Vector3d *)&local_150);
                }
                ppAVar20 = ppAVar20 + 1;
                pAVar24 = (Atom *)0x0;
                if (ppAVar20 !=
                    (pMVar16->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
LAB_002041ca:
                  pAVar24 = *ppAVar20;
                }
              }
              pMVar16 = SimInfo::nextMolecule(this->info_,&mi);
            }
          }
        }
        iVar25 = 1;
      }
      uVar26 = 1;
    }
    *pot = local_590 + *pot;
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&qxk.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&dxk.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&qks.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&qkc.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dks.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dkc.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cks.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ckc.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&skr.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ckr.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&slm.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&clm.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&ens);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&ems);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&els);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&enc);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&emc);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&elc);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&AK.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Electrostatic::ReciprocalSpaceSum(RealType& pot) {
    RealType kPot = 0.0;
    RealType kVir = 0.0;
    // Mat3x3d kVirTens(0.0);

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d box = hmat.diagonals();
    RealType boxMax = box.max();

    // int kMax = int(2.0 * Constants::PI / (pow(dampingAlpha_,2)*cutoffRadius_
    // * boxMax) );
    int kMax   = 7;
    int kSqMax = kMax * kMax + 2;

    int kLimit = kMax + 1;
    int kLim2  = 2 * kMax + 1;
    int kSqLim = kSqMax;

    vector<RealType> AK(kSqLim + 1, 0.0);
    RealType xcl  = 2.0 * Constants::PI / box.x();
    RealType ycl  = 2.0 * Constants::PI / box.y();
    RealType zcl  = 2.0 * Constants::PI / box.z();
    RealType rcl  = 2.0 * Constants::PI / boxMax;
    RealType rvol = 2.0 * Constants::PI / (box.x() * box.y() * box.z());

    if (dampingAlpha_ < 1.0e-12) return;

    RealType ralph = -0.25 / pow(dampingAlpha_, 2);

    // Calculate and store exponential factors

    vector<vector<RealType>> elc;
    vector<vector<RealType>> emc;
    vector<vector<RealType>> enc;
    vector<vector<RealType>> els;
    vector<vector<RealType>> ems;
    vector<vector<RealType>> ens;

    int nMax = info_->getNAtoms();

    elc.resize(kLimit + 1);
    emc.resize(kLimit + 1);
    enc.resize(kLimit + 1);
    els.resize(kLimit + 1);
    ems.resize(kLimit + 1);
    ens.resize(kLimit + 1);

    for (int j = 0; j < kLimit + 1; j++) {
      elc[j].resize(nMax);
      emc[j].resize(nMax);
      enc[j].resize(nMax);
      els[j].resize(nMax);
      ems[j].resize(nMax);
      ens[j].resize(nMax);
    }

    Vector3d t(2.0 * Constants::PI);
    t.Vdiv(t, box);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    int i;
    Vector3d r;
    Vector3d tt;

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        i = atom->getLocalIndex();
        r = atom->getPos();
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

        tt.Vmul(t, r);

        elc[1][i] = 1.0;
        emc[1][i] = 1.0;
        enc[1][i] = 1.0;
        els[1][i] = 0.0;
        ems[1][i] = 0.0;
        ens[1][i] = 0.0;

        elc[2][i] = cos(tt.x());
        emc[2][i] = cos(tt.y());
        enc[2][i] = cos(tt.z());
        els[2][i] = sin(tt.x());
        ems[2][i] = sin(tt.y());
        ens[2][i] = sin(tt.z());

        for (int l = 3; l <= kLimit; l++) {
          elc[l][i] = elc[l - 1][i] * elc[2][i] - els[l - 1][i] * els[2][i];
          emc[l][i] = emc[l - 1][i] * emc[2][i] - ems[l - 1][i] * ems[2][i];
          enc[l][i] = enc[l - 1][i] * enc[2][i] - ens[l - 1][i] * ens[2][i];
          els[l][i] = els[l - 1][i] * elc[2][i] + elc[l - 1][i] * els[2][i];
          ems[l][i] = ems[l - 1][i] * emc[2][i] + emc[l - 1][i] * ems[2][i];
          ens[l][i] = ens[l - 1][i] * enc[2][i] + enc[l - 1][i] * ens[2][i];
        }
      }
    }

    // Calculate and store AK coefficients:

    RealType eksq = 1.0;
    RealType expf = 0.0;
    if (ralph < 0.0) expf = exp(ralph * rcl * rcl);
    for (i = 1; i <= kSqLim; i++) {
      RealType rksq = float(i) * rcl * rcl;
      eksq          = expf * eksq;
      AK[i]         = eConverter * eksq / rksq;
    }

    /*
     * Loop over all k vectors k = 2 pi (ll/Lx, mm/Ly, nn/Lz)
     * the values of ll, mm and nn are selected so that the symmetry of
     * reciprocal lattice is taken into account i.e. the following
     * rules apply.
     *
     * ll ranges over the values 0 to kMax only.
     *
     * mm ranges over 0 to kMax when ll=0 and over
     *            -kMax to kMax otherwise.
     * nn ranges over 1 to kMax when ll=mm=0 and over
     *            -kMax to kMax otherwise.
     *
     * Hence the result of the summation must be doubled at the end.
     */

    std::vector<RealType> clm(nMax, 0.0);
    std::vector<RealType> slm(nMax, 0.0);
    std::vector<RealType> ckr(nMax, 0.0);
    std::vector<RealType> skr(nMax, 0.0);
    std::vector<RealType> ckc(nMax, 0.0);
    std::vector<RealType> cks(nMax, 0.0);
    std::vector<RealType> dkc(nMax, 0.0);
    std::vector<RealType> dks(nMax, 0.0);
    std::vector<RealType> qkc(nMax, 0.0);
    std::vector<RealType> qks(nMax, 0.0);
    std::vector<Vector3d> dxk(nMax, V3Zero);
    std::vector<Vector3d> qxk(nMax, V3Zero);
    RealType rl, rm, rn;
    Vector3d kVec;
    Vector3d Qk;
    // RealType k2;
    Mat3x3d Kmat;
    RealType ckcs, ckss, dkcs, dkss, qkcs, qkss;
    int atid;
    ElectrostaticAtomData data;
    RealType C, dk, qk;
    Vector3d D;
    Mat3x3d Q;

    int mMin = kLimit;
    int nMin = kLimit + 1;
    for (int l = 1; l <= kLimit; l++) {
      int ll = l - 1;
      rl     = xcl * float(ll);
      for (int mmm = mMin; mmm <= kLim2; mmm++) {
        int mm = mmm - kLimit;
        int m  = abs(mm) + 1;
        rm     = ycl * float(mm);
        // Set temporary products of exponential terms
        for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
             mol           = info_->nextMolecule(mi)) {
          for (Atom* atom = mol->beginAtom(ai); atom != NULL;
               atom       = mol->nextAtom(ai)) {
            i = atom->getLocalIndex();
            if (mm < 0) {
              clm[i] = elc[l][i] * emc[m][i] + els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] - ems[m][i] * elc[l][i];
            } else {
              clm[i] = elc[l][i] * emc[m][i] - els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] + ems[m][i] * elc[l][i];
            }
          }
        }
        for (int nnn = nMin; nnn <= kLim2; nnn++) {
          int nn = nnn - kLimit;
          int n  = abs(nn) + 1;
          rn     = zcl * float(nn);
          // Test on magnitude of k vector:
          int kk = ll * ll + mm * mm + nn * nn;
          if (kk <= kSqLim) {
            kVec = Vector3d(rl, rm, rn);
            // k2     = dot(kVec, kVec);  // length^2 of kVec
            Kmat = outProduct(kVec, kVec);  // kMatrix
            // Calculate exp(ikr) terms
            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i = atom->getLocalIndex();

                if (nn < 0) {
                  ckr[i] = clm[i] * enc[n][i] + slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] - clm[i] * ens[n][i];

                } else {
                  ckr[i] = clm[i] * enc[n][i] - slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] + clm[i] * ens[n][i];
                }
              }
            }

            // Calculate scalar and vector products for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i        = atom->getLocalIndex();
                int atid = atom->getAtomType()->getIdent();
                data     = ElectrostaticMap[Etids[atid]];

                if (data.is_Charge) {
                  C = data.fixedCharge;
                  if (data.is_Fluctuating) C += atom->getFlucQPos();
                  ckc[i] = C * ckr[i];
                  cks[i] = C * skr[i];
                }

                if (data.is_Dipole) {
                  D      = atom->getDipole() * mPoleConverter;
                  dk     = dot(D, kVec);
                  dxk[i] = cross(D, kVec);
                  dkc[i] = dk * ckr[i];
                  dks[i] = dk * skr[i];
                }
                if (data.is_Quadrupole) {
                  Q      = atom->getQuadrupole() * mPoleConverter;
                  Qk     = Q * kVec;
                  qk     = dot(kVec, Qk);
                  qxk[i] = -cross(kVec, Qk);
                  qkc[i] = qk * ckr[i];
                  qks[i] = qk * skr[i];
                }
              }
            }

            // calculate vector sums

            ckcs = std::accumulate(ckc.begin(), ckc.end(), 0.0);
            ckss = std::accumulate(cks.begin(), cks.end(), 0.0);
            dkcs = std::accumulate(dkc.begin(), dkc.end(), 0.0);
            dkss = std::accumulate(dks.begin(), dks.end(), 0.0);
            qkcs = std::accumulate(qkc.begin(), qkc.end(), 0.0);
            qkss = std::accumulate(qks.begin(), qks.end(), 0.0);

#ifdef IS_MPI
            MPI_Allreduce(MPI_IN_PLACE, &ckcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &ckss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
#endif

            // Accumulate potential energy and virial contribution:

            kPot += 2.0 * rvol * AK[kk] *
                    ((ckss + dkcs - qkss) * (ckss + dkcs - qkss) +
                     (ckcs - dkss - qkcs) * (ckcs - dkss - qkcs));

            kVir +=
                2.0 * rvol * AK[kk] *
                (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss) +
                 3.0 * (dkcs * dkcs + dkss * dkss) -
                 6.0 * (ckss * qkss + ckcs * qkcs) +
                 8.0 * (dkss * qkcs - dkcs * qkss) +
                 5.0 * (qkss * qkss + qkcs * qkcs));

            // kVirTens += 2 * rvol * AK[kk] *
            //   ( Mat3x3d::identity() - 2.0*( 1.0 / k2 - ralph) * Kmat ) *
            //   (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss)
            //   +
            //    3.0 * (dkcs * dkcs + dkss * dkss) -
            //    6.0 * (ckss * qkss + ckcs * qkcs) +
            //    8.0 * (dkss * qkcs - dkcs * qkss) +
            //    5.0 * (qkss * qkss + qkcs * qkcs));

            // Calculate force and torque for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i    = atom->getLocalIndex();
                atid = atom->getAtomType()->getIdent();
                data = ElectrostaticMap[Etids[atid]];

                RealType qfrc =
                    AK[kk] *
                    ((cks[i] + dkc[i] - qks[i]) * (ckcs - dkss - qkcs) -
                     (ckc[i] - dks[i] - qkc[i]) * (ckss + dkcs - qkss));
                RealType qtrq1 = AK[kk] * (skr[i] * (ckcs - dkss - qkcs) -
                                           ckr[i] * (ckss + dkcs - qkss));
                RealType qtrq2 = 2.0 * AK[kk] *
                                 (ckr[i] * (ckcs - dkss - qkcs) +
                                  skr[i] * (ckss + dkcs - qkss));

                atom->addFrc(4.0 * rvol * qfrc * kVec);

                if (data.is_Fluctuating) {
                  atom->addFlucQFrc(-2.0 * rvol * qtrq2);
                }

                if (data.is_Dipole) {
                  atom->addTrq(4.0 * rvol * qtrq1 * dxk[i]);
                }
                if (data.is_Quadrupole) {
                  atom->addTrq(4.0 * rvol * qtrq2 * qxk[i]);
                }
              }
            }
          }
        }
        nMin = 1;
      }
      mMin = 1;
    }
    pot += kPot;
    //    virialTensor += kVirTens;
  }